

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  string *this;
  bool bVar1;
  string sStack_128;
  string *local_108;
  RegularExpression urlRe;
  
  local_108 = dataport;
  RegularExpression::RegularExpression
            (&urlRe,"([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]*)(:([0-9]+))?/(.+)?");
  bVar1 = RegularExpression::find(&urlRe,URL);
  if (bVar1) {
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,3);
    std::__cxx11::string::operator=((string *)username,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,5);
    std::__cxx11::string::operator=((string *)password,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,6);
    std::__cxx11::string::operator=((string *)hostname,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,8);
    std::__cxx11::string::operator=((string *)local_108,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_128,&urlRe.regmatch,9);
    std::__cxx11::string::operator=((string *)database,(string *)&sStack_128);
    std::__cxx11::string::~string((string *)&sStack_128);
    if (decode) {
      DecodeURL(&sStack_128,username);
      std::__cxx11::string::operator=((string *)username,(string *)&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      DecodeURL(&sStack_128,password);
      std::__cxx11::string::operator=((string *)password,(string *)&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      DecodeURL(&sStack_128,hostname);
      std::__cxx11::string::operator=((string *)hostname,(string *)&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      this = local_108;
      DecodeURL(&sStack_128,local_108);
      std::__cxx11::string::operator=((string *)this,(string *)&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      DecodeURL(&sStack_128,database);
      std::__cxx11::string::operator=((string *)database,(string *)&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
    }
  }
  RegularExpression::~RegularExpression(&urlRe);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}